

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpCodeUtil.cpp
# Opt level: O0

OpCode Js::OpCodeUtil::DebugConvertProfiledCallToNonProfiled(OpCode op)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  OpCode local_a;
  OpCode op_local;
  
  switch(op) {
  case ProfiledCallI:
  case ProfiledCallIWithICIndex:
    local_a = CallI;
    break;
  case ProfiledCallIFlags:
  case ProfiledCallIFlagsWithICIndex:
    local_a = CallIFlags;
    break;
  case ProfiledCallIExtended:
  case ProfiledCallIExtendedWithICIndex:
    local_a = CallIExtended;
    break;
  case ProfiledCallIExtendedFlags:
  case ProfiledCallIExtendedFlagsWithICIndex:
    local_a = CallIExtendedFlags;
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/OpCodeUtil.cpp"
                                ,0x68,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
    local_a = Nop;
  }
  return local_a;
}

Assistant:

OpCode OpCodeUtil::DebugConvertProfiledCallToNonProfiled(OpCode op)
    {
        switch (op)
        {
        case Js::OpCode::ProfiledCallI:
        case Js::OpCode::ProfiledCallIWithICIndex:
            return Js::OpCode::CallI;
        case Js::OpCode::ProfiledCallIFlags:
        case Js::OpCode::ProfiledCallIFlagsWithICIndex:
            return Js::OpCode::CallIFlags;
        case Js::OpCode::ProfiledCallIExtendedFlags:
        case Js::OpCode::ProfiledCallIExtendedFlagsWithICIndex:
            return Js::OpCode::CallIExtendedFlags;
        case Js::OpCode::ProfiledCallIExtended:
        case Js::OpCode::ProfiledCallIExtendedWithICIndex:
            return Js::OpCode::CallIExtended;
        default:
            Assert(false);
        };
        return Js::OpCode::Nop;
    }